

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_storage_info.cpp
# Opt level: O2

void duckdb::PragmaStorageInfoFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  _func_int **__n;
  int64_t *piVar1;
  FunctionData *pFVar2;
  GlobalTableFunctionState *pGVar3;
  ColumnList *this;
  const_reference pvVar4;
  long lVar5;
  ColumnDefinition *this_00;
  string *psVar6;
  ulong index;
  int64_t *piVar7;
  Value local_208;
  vector<duckdb::Value,_true> blocks;
  LogicalType local_190;
  LogicalType local_178;
  LogicalType local_160;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_88 [24];
  Value local_70;
  
  pFVar2 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&data_p->bind_data);
  pGVar3 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  this = TableCatalogEntry::GetColumns((TableCatalogEntry *)pFVar2[4]._vptr_FunctionData);
  index = 0;
  while( true ) {
    __n = pGVar3[1]._vptr_GlobalTableFunctionState;
    if (((_func_int **)
         (((long)pFVar2[6]._vptr_FunctionData - (long)pFVar2[5]._vptr_FunctionData) / 0xf8) <= __n)
       || (0x7ff < index)) break;
    pGVar3[1]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
    pvVar4 = vector<duckdb::ColumnSegmentInfo,_true>::get<true>
                       ((vector<duckdb::ColumnSegmentInfo,_true> *)(pFVar2 + 5),(size_type)__n);
    lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar4->row_group_index);
    Value::BIGINT(&local_208,lVar5);
    DataChunk::SetValue(output,0,index,&local_208);
    Value::~Value(&local_208);
    this_00 = ColumnList::GetColumn(this,(PhysicalIndex)pvVar4->column_id);
    psVar6 = ColumnDefinition::Name_abi_cxx11_(this_00);
    ::std::__cxx11::string::string((string *)&local_a8,(string *)psVar6);
    Value::Value(&local_208,&local_a8);
    DataChunk::SetValue(output,1,index,&local_208);
    Value::~Value(&local_208);
    ::std::__cxx11::string::~string((string *)&local_a8);
    lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar4->column_id);
    Value::BIGINT(&local_208,lVar5);
    DataChunk::SetValue(output,2,index,&local_208);
    Value::~Value(&local_208);
    ::std::__cxx11::string::string((string *)&local_c8,(string *)&pvVar4->column_path);
    Value::Value(&local_208,&local_c8);
    DataChunk::SetValue(output,3,index,&local_208);
    Value::~Value(&local_208);
    ::std::__cxx11::string::~string((string *)&local_c8);
    lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar4->segment_idx);
    Value::BIGINT(&local_208,lVar5);
    DataChunk::SetValue(output,4,index,&local_208);
    Value::~Value(&local_208);
    ::std::__cxx11::string::string((string *)&local_e8,(string *)&pvVar4->segment_type);
    Value::Value(&local_208,&local_e8);
    DataChunk::SetValue(output,5,index,&local_208);
    Value::~Value(&local_208);
    ::std::__cxx11::string::~string((string *)&local_e8);
    lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar4->segment_start);
    Value::BIGINT(&local_208,lVar5);
    DataChunk::SetValue(output,6,index,&local_208);
    Value::~Value(&local_208);
    lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar4->segment_count);
    Value::BIGINT(&local_208,lVar5);
    DataChunk::SetValue(output,7,index,&local_208);
    Value::~Value(&local_208);
    ::std::__cxx11::string::string((string *)&local_108,(string *)&pvVar4->compression_type);
    Value::Value(&local_208,&local_108);
    DataChunk::SetValue(output,8,index,&local_208);
    Value::~Value(&local_208);
    ::std::__cxx11::string::~string((string *)&local_108);
    ::std::__cxx11::string::string((string *)&local_128,(string *)&pvVar4->segment_stats);
    Value::Value(&local_208,&local_128);
    DataChunk::SetValue(output,9,index,&local_208);
    Value::~Value(&local_208);
    ::std::__cxx11::string::~string((string *)&local_128);
    Value::BOOLEAN(&local_208,pvVar4->has_updates);
    DataChunk::SetValue(output,10,index,&local_208);
    Value::~Value(&local_208);
    Value::BOOLEAN(&local_208,pvVar4->persistent);
    DataChunk::SetValue(output,0xb,index,&local_208);
    Value::~Value(&local_208);
    if (pvVar4->persistent == true) {
      Value::BIGINT(&local_208,pvVar4->block_id);
      DataChunk::SetValue(output,0xc,index,&local_208);
      Value::~Value(&local_208);
      lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar4->block_offset);
      Value::BIGINT(&local_208,lVar5);
      DataChunk::SetValue(output,0xd,index,&local_208);
      Value::~Value(&local_208);
    }
    else {
      LogicalType::LogicalType(&local_160,SQLNULL);
      Value::Value(&local_208,&local_160);
      DataChunk::SetValue(output,0xc,index,&local_208);
      Value::~Value(&local_208);
      LogicalType::~LogicalType(&local_160);
      LogicalType::LogicalType(&local_178,SQLNULL);
      Value::Value(&local_208,&local_178);
      DataChunk::SetValue(output,0xd,index,&local_208);
      Value::~Value(&local_208);
      LogicalType::~LogicalType(&local_178);
    }
    ::std::__cxx11::string::string((string *)&local_148,(string *)&pvVar4->segment_info);
    Value::Value(&local_208,&local_148);
    DataChunk::SetValue(output,0xe,index,&local_208);
    Value::~Value(&local_208);
    ::std::__cxx11::string::~string((string *)&local_148);
    if (pvVar4->persistent == true) {
      blocks.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      blocks.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      blocks.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      piVar1 = (pvVar4->additional_blocks).super_vector<long,_std::allocator<long>_>.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (piVar7 = (pvVar4->additional_blocks).super_vector<long,_std::allocator<long>_>.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start; piVar7 != piVar1; piVar7 = piVar7 + 1) {
        Value::BIGINT(&local_208,*piVar7);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&blocks,&local_208);
        Value::~Value(&local_208);
      }
      LogicalType::LogicalType(&local_208.type_,BIGINT);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                (local_88,&blocks.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
      Value::LIST(&local_70,&local_208.type_,(vector<duckdb::Value,_true> *)local_88);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_88);
      LogicalType::~LogicalType(&local_208.type_);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&blocks);
      DataChunk::SetValue(output,0xf,index,&local_70);
      Value::~Value(&local_70);
    }
    else {
      LogicalType::LogicalType(&local_190,SQLNULL);
      Value::Value(&local_208,&local_190);
      DataChunk::SetValue(output,0xf,index,&local_208);
      Value::~Value(&local_208);
      LogicalType::~LogicalType(&local_190);
    }
    index = index + 1;
  }
  output->count = index;
  return;
}

Assistant:

static void PragmaStorageInfoFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &bind_data = data_p.bind_data->Cast<PragmaStorageFunctionData>();
	auto &data = data_p.global_state->Cast<PragmaStorageOperatorData>();
	idx_t count = 0;
	auto &columns = bind_data.table_entry.GetColumns();
	while (data.offset < bind_data.column_segments_info.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = bind_data.column_segments_info[data.offset++];

		idx_t col_idx = 0;
		// row_group_id
		output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.row_group_index)));
		// column_name
		auto &col = columns.GetColumn(PhysicalIndex(entry.column_id));
		output.SetValue(col_idx++, count, Value(col.Name()));
		// column_id
		output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.column_id)));
		// column_path
		output.SetValue(col_idx++, count, Value(entry.column_path));
		// segment_id
		output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.segment_idx)));
		// segment_type
		output.SetValue(col_idx++, count, Value(entry.segment_type));
		// start
		output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.segment_start)));
		// count
		output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.segment_count)));
		// compression
		output.SetValue(col_idx++, count, Value(entry.compression_type));
		// stats
		output.SetValue(col_idx++, count, Value(entry.segment_stats));
		// has_updates
		output.SetValue(col_idx++, count, Value::BOOLEAN(entry.has_updates));
		// persistent
		output.SetValue(col_idx++, count, Value::BOOLEAN(entry.persistent));
		// block_id
		// block_offset
		if (entry.persistent) {
			output.SetValue(col_idx++, count, Value::BIGINT(entry.block_id));
			output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.block_offset)));
		} else {
			output.SetValue(col_idx++, count, Value());
			output.SetValue(col_idx++, count, Value());
		}
		// segment_info
		output.SetValue(col_idx++, count, Value(entry.segment_info));
		// additional_block_ids
		if (entry.persistent) {
			output.SetValue(col_idx++, count, ValueFromBlockIdList(entry.additional_blocks));
		} else {
			output.SetValue(col_idx++, count, Value());
		}
		count++;
	}
	output.SetCardinality(count);
}